

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.C
# Opt level: O3

bool __thiscall Search::excludeFileByContent(Search *this,string *path)

{
  allocator *paVar1;
  FILE *f;
  bool bVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  int *piVar5;
  bool bVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string_view fmt_00;
  format_args args_00;
  char buf [1024];
  undefined1 local_498 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  char *local_478;
  undefined8 local_470;
  undefined1 local_468;
  undefined1 local_464;
  undefined2 local_460;
  undefined1 local_45e;
  undefined1 *local_458;
  undefined8 uStack_450;
  undefined1 local_448 [15];
  char cStack_439;
  allocator *local_438;
  code *pcStack_430;
  pointer local_428;
  size_type sStack_420;
  undefined1 *local_418;
  undefined8 uStack_410;
  
  std::__cxx11::string::string
            ((string *)&local_438,(path->_M_dataplus)._M_p,(allocator *)&local_478);
  paVar1 = (allocator *)(local_498 + 0x10);
  local_488._M_allocated_capacity._0_2_ = 0x72;
  local_498._8_8_ = 1;
  local_498._0_8_ = paVar1;
  __stream = Utils::fopen((char *)&local_438,local_498);
  if ((allocator *)local_498._0_8_ != paVar1) {
    operator_delete((void *)local_498._0_8_);
  }
  if (local_438 != (allocator *)&local_428) {
    operator_delete(local_438);
  }
  f = _stderr;
  if (__stream == (FILE *)0x0) {
    local_478 = "ERROR:";
    local_470 = 0xff000000000001;
    local_468 = 0;
    local_464 = 0;
    local_460 = 1;
    local_45e = 0;
    piVar5 = __errno_location();
    Utils::strerror_abi_cxx11_((Utils *)&local_458,*piVar5);
    local_428 = (path->_M_dataplus)._M_p;
    sStack_420 = path->_M_string_length;
    pcStack_430 = ::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                  ::
                  format_custom_arg<fmt::v10::detail::styled_arg<char[7]>,fmt::v10::formatter<fmt::v10::detail::styled_arg<char[7]>,char,void>>
    ;
    local_418 = local_458;
    uStack_410 = uStack_450;
    fmt.size_ = 0xddf;
    fmt.data_ = (char *)0x1e;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_438;
    local_438 = (allocator *)&local_478;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_498,(v10 *)"{} Failed to open file {} : {}",fmt,args);
    local_438 = (allocator *)local_498._0_8_;
    pcStack_430 = (code *)local_498._8_8_;
    fmt_00.size_ = 3;
    fmt_00.data_ = "{}\n";
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_438;
    args_00.desc_ = 0xd;
    ::fmt::v10::vprint(f,fmt_00,args_00);
    if ((allocator *)local_498._0_8_ != paVar1) {
      operator_delete((void *)local_498._0_8_);
    }
    if (local_458 != local_448) {
      operator_delete(local_458);
    }
    bVar6 = false;
  }
  else {
    do {
      pcVar3 = fgets((char *)&local_438,0x400,__stream);
      bVar6 = pcVar3 != (char *)0x0;
      if (pcVar3 == (char *)0x0) break;
      for (sVar4 = strlen((char *)&local_438);
          (sVar4 != 0 && (((&cStack_439)[sVar4] == '\r' || ((&cStack_439)[sVar4] == '\n'))));
          sVar4 = sVar4 - 1) {
        (&cStack_439)[sVar4] = '\0';
      }
      local_498._0_8_ = paVar1;
      sVar4 = strlen((char *)&local_438);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,&local_438,(long)&local_438 + sVar4);
      bVar2 = Filter::excludeContent(&this->_filter,(string *)local_498);
      if ((allocator *)local_498._0_8_ != paVar1) {
        operator_delete((void *)local_498._0_8_);
      }
    } while (!bVar2);
    ::fclose(__stream);
  }
  return bVar6;
}

Assistant:

bool Search::excludeFileByContent(std::string const & path) const
{
    bool rval = false;
    std::unique_ptr<FILE, decltype(&fclose)> f(Utils::fopen(path.c_str(), "r"), &fclose);
    if (!f) {
        fmt::println(stderr, "{} Failed to open file {} : {}",
                    fmt::styled("ERROR:", fmt::fg(fmt::color::red)),
                    path,
                    Utils::strerror(errno));
        return rval;
    }

    char buf[1024];
    while (!rval && fgets(buf, sizeof(buf), f.get()) != nullptr) {
        // Remove trailing CR and LF characters
        size_t sz = strlen(buf);
        while (sz > 0 && (buf[sz - 1] == '\n' || buf[sz - 1] == '\r')) {
            buf[--sz] = '\0';
        }
        rval = _filter.excludeContent(buf);
    }
    return rval;
}